

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O2

PropertyBase *
Protocol::MQTT::V5::
TypedProperty<(Protocol::MQTT::V5::PropertyType)38,_Protocol::MQTT::Common::DynamicStringPair>::
allocateProp(void)

{
  PropertyBase *this;
  DynamicString local_70;
  DynamicString local_5e;
  DynamicStringPair local_4c;
  
  this = (PropertyBase *)operator_new(0x48);
  Common::DynamicString::DynamicString(&local_5e,"");
  Common::DynamicString::DynamicString(&local_70,"");
  Common::DynamicStringPair::DynamicStringPair(&local_4c,&local_5e,&local_70);
  Property<Protocol::MQTT::Common::DynamicStringPair>::Property
            ((Property<Protocol::MQTT::Common::DynamicStringPair> *)this,UserProperty,&local_4c,true
            );
  Common::DynamicStringPair::~DynamicStringPair(&local_4c);
  free(local_70.data);
  free(local_5e.data);
  return this;
}

Assistant:

static PropertyBase * allocateProp() { return new Property<T>(type, T(), true) ; }